

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::SparseSupportVectors::ByteSizeLong(SparseSupportVectors *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  uint index;
  ulong uVar5;
  
  uVar1 = (this->vectors_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar1;
  index = 0;
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SparseVector>::TypeHandler>
                          (&(this->vectors_).super_RepeatedPtrFieldBase,index);
      sVar4 = SparseVector::ByteSizeLong(this_00);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = uVar5 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  this->_cached_size_ = (int)uVar5;
  return uVar5;
}

Assistant:

size_t SparseSupportVectors::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SparseSupportVectors)
  size_t total_size = 0;

  // repeated .CoreML.Specification.SparseVector vectors = 1;
  {
    unsigned int count = this->vectors_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->vectors(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}